

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void action_for_each_trigger(char *trigger,_func_void_action_ptr *func)

{
  int iVar1;
  listnode *plVar2;
  
  plVar2 = &action_list;
  while (plVar2 = (((action *)plVar2)->alist).next, plVar2 != &action_list) {
    iVar1 = strcmp(((action *)plVar2)->name,trigger);
    if (iVar1 == 0) {
      (*func)((action *)plVar2);
    }
  }
  return;
}

Assistant:

void action_for_each_trigger(const char *trigger,
                             void (*func)(struct action *act))
{
    struct listnode *node;
    struct action *act;
    list_for_each(node, &action_list) {
        act = node_to_item(node, struct action, alist);
        if (!strcmp(act->name, trigger)) {
            func(act);
        }
    }
}